

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  Tokenizer *this_00;
  TokenType TVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar1 = (this->tokenizer_).current_.type;
  if (TVar1 == TYPE_STRING) {
    this_00 = &this->tokenizer_;
    text->_M_string_length = 0;
    *(text->_M_dataplus)._M_p = '\0';
    if ((this_00->current_).type == TYPE_STRING) {
      do {
        io::Tokenizer::ParseStringAppend(&(this->tokenizer_).current_.text,text);
        io::Tokenizer::Next(this_00);
      } while ((this_00->current_).type == TYPE_STRING);
    }
  }
  else {
    std::operator+(&local_48,"Expected string, got: ",&(this->tokenizer_).current_.text);
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool ConsumeString(std::string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError("Expected string, got: " + tokenizer_.current().text);
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }